

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v11::basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::move
          (basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *this
          ,basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>
           *other)

{
  uint *puVar1;
  uint *puVar2;
  ulong count;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  puVar2 = (other->super_buffer<unsigned_int>).ptr_;
  count = (other->super_buffer<unsigned_int>).size_;
  sVar3 = (other->super_buffer<unsigned_int>).capacity_;
  puVar1 = other->store_;
  if (puVar2 == puVar1) {
    (this->super_buffer<unsigned_int>).ptr_ = this->store_;
    (this->super_buffer<unsigned_int>).capacity_ = sVar3;
    for (lVar5 = 0; count * 4 - lVar5 != 0; lVar5 = lVar5 + 4) {
      *(undefined4 *)((long)this->store_ + lVar5) = *(undefined4 *)((long)puVar1 + lVar5);
    }
    uVar4 = (this->super_buffer<unsigned_int>).capacity_;
    if (uVar4 < count) {
      (*(this->super_buffer<unsigned_int>).grow_)(&this->super_buffer<unsigned_int>,count);
      uVar4 = (this->super_buffer<unsigned_int>).capacity_;
    }
    if (count < uVar4) {
      uVar4 = count;
    }
    (this->super_buffer<unsigned_int>).size_ = uVar4;
    return;
  }
  (this->super_buffer<unsigned_int>).ptr_ = puVar2;
  (this->super_buffer<unsigned_int>).capacity_ = sVar3;
  (other->super_buffer<unsigned_int>).ptr_ = puVar1;
  (other->super_buffer<unsigned_int>).size_ = 0;
  (other->super_buffer<unsigned_int>).capacity_ = 0;
  detail::buffer<unsigned_int>::try_resize(&this->super_buffer<unsigned_int>,count);
  return;
}

Assistant:

FMT_CONSTEXPR20 void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      detail::copy<T>(other.store_, other.store_ + size, store_);
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
      other.clear();
    }
    this->resize(size);
  }